

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

size_t path_build(char *buf,size_t len,char *base,char *leaf)

{
  _Bool _Var1;
  bool bVar2;
  _Bool local_3d;
  char *pcStack_38;
  int starts_with_separator;
  size_t cur_len;
  char *leaf_local;
  char *base_local;
  size_t len_local;
  char *buf_local;
  
  pcStack_38 = (char *)0x0;
  *buf = '\0';
  cur_len = (size_t)leaf;
  leaf_local = base;
  base_local = (char *)len;
  len_local = (size_t)buf;
  if ((leaf == (char *)0x0) || (*leaf == '\0')) {
    if ((base != (char *)0x0) && (*base != '\0')) {
      path_process(buf,len,(size_t *)&stack0xffffffffffffffc8,base);
    }
    buf_local = pcStack_38;
  }
  else {
    local_3d = true;
    if ((base != (char *)0x0) && (local_3d = true, *base != '\0')) {
      local_3d = prefix(leaf,"/");
    }
    bVar2 = true;
    if (local_3d == false) {
      bVar2 = *(char *)cur_len == '~';
    }
    if (bVar2) {
      path_process((char *)len_local,(size_t)base_local,(size_t *)&stack0xffffffffffffffc8,
                   (char *)cur_len);
      buf_local = pcStack_38;
    }
    else {
      path_process((char *)len_local,(size_t)base_local,(size_t *)&stack0xffffffffffffffc8,
                   leaf_local);
      _Var1 = suffix(leaf_local,"/");
      if (!_Var1) {
        strnfcat((char *)len_local,(size_t)base_local,(size_t *)&stack0xffffffffffffffc8,"%s","/");
      }
      path_process((char *)len_local,(size_t)base_local,(size_t *)&stack0xffffffffffffffc8,
                   (char *)cur_len);
      buf_local = pcStack_38;
    }
  }
  return (size_t)buf_local;
}

Assistant:

size_t path_build(char *buf, size_t len, const char *base, const char *leaf)
{
	size_t cur_len = 0;
	int starts_with_separator;

	buf[0] = '\0';

	if (!leaf || !leaf[0]) {
		if (base && base[0])
			path_process(buf, len, &cur_len, base);

		return cur_len;
	}


	/*
	 * If the leafname starts with the separator,
	 *   or with the tilde (on Unix),
	 *   or there's no base path,
	 * We use the leafname only.
	 */
	starts_with_separator = (!base || !base[0]) || prefix(leaf, PATH_SEP);
#if defined(UNIX)
	starts_with_separator = starts_with_separator || leaf[0] == '~';
#endif
	if (starts_with_separator) {
		path_process(buf, len, &cur_len, leaf);
		return cur_len;
	}


	/* There is both a relative leafname and a base path from which it is
	 * relative */
	path_process(buf, len, &cur_len, base);

	if (!suffix(base, PATH_SEP)) {
		/* Append separator if it isn't already in the string. */
		strnfcat(buf, len, &cur_len, "%s", PATH_SEP);
	}

	path_process(buf, len, &cur_len, leaf);

	return cur_len;
}